

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aialgorithm.cpp
# Opt level: O2

void __thiscall Test_aialgorithm_countOf_Test::TestBody(Test_aialgorithm_countOf_Test *this)

{
  char *pcVar1;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_28.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"ai::countOf(buf1)","1",(unsigned_long *)&local_20,
             (int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
               ,0x1e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_20.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    local_28.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)&gtest_ar,"ai::countOf(buf2)","1",(unsigned_long *)&local_20,
               (int *)&local_28);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_20);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                 ,0x20,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      local_20.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d2;
      local_28.data_._0_4_ = 0x4d2;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)&gtest_ar,"ai::countOf(buf3)","1234",(unsigned_long *)&local_20,
                 (int *)&local_28);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_20);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x22,pcVar1);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
        local_20.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4d2;
        local_28.data_._0_4_ = 0x4d2;
        testing::internal::CmpHelperEQ<unsigned_long,int>
                  ((internal *)&gtest_ar,"ai::countOf(buf4)","1234",(unsigned_long *)&local_20,
                   (int *)&local_28);
        if (gtest_ar.success_ != false) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&gtest_ar.message_);
          local_20.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x7b;
          local_28.data_._0_4_ = 0x7b;
          testing::internal::CmpHelperEQ<unsigned_long,int>
                    ((internal *)&gtest_ar,"ai::countOf(buf5)","123",(unsigned_long *)&local_20,
                     (int *)&local_28);
          if (gtest_ar.success_ == false) {
            testing::Message::Message((Message *)&local_20);
            if (gtest_ar.message_.ptr_ ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar1 = "";
            }
            else {
              pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_28,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                       ,0x2e,pcVar1);
            testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
            testing::internal::AssertHelper::~AssertHelper(&local_28);
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_20);
          }
          goto LAB_0010a7a6;
        }
        testing::Message::Message((Message *)&local_20);
        if (gtest_ar.message_.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar1 = "";
        }
        else {
          pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/aicpp[P]ailib/test/src/test_aialgorithm.cpp"
                   ,0x24,pcVar1);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_28);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
LAB_0010a7a6:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(Test_aialgorithm, countOf)
{
    char buf1[1];
    ASSERT_EQ(ai::countOf(buf1), 1);
    int buf2[1];
    ASSERT_EQ(ai::countOf(buf2), 1);
    char buf3[1234];
    ASSERT_EQ(ai::countOf(buf3), 1234);
    int buf4[1234];
    ASSERT_EQ(ai::countOf(buf4), 1234);
    constexpr auto val4 = ai::countOf(buf4);
    static_assert(val4 == 1234, "");

    struct A
    {
        int    a;
        double f;
    };
    A buf5[123];
    ASSERT_EQ(ai::countOf(buf5), 123);
}